

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

FrameDisplay * __thiscall
Js::InterpreterStackFrame::NewFrameDisplay(InterpreterStackFrame *this,void *argHead,void *argEnv)

{
  undefined2 uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  FrameDisplay *pFVar5;
  undefined4 *puVar6;
  void *item;
  uint index;
  uint index_00;
  
  uVar1 = *(undefined2 *)
           &((*(FunctionBody **)(this + 0x88))->super_ParseableFunctionInfo).super_FunctionProxy.
            field_0x45;
  bVar3 = FunctionBody::DoStackFrameDisplay(*(FunctionBody **)(this + 0x88));
  if ((!bVar3) || (pFVar5 = GetLocalFrameDisplay(this), pFVar5 == (FrameDisplay *)0x0)) {
    pFVar5 = OP_LdFrameDisplay(this,argHead,argEnv,*(ScriptContext **)(this + 0x78));
    *(FrameDisplay **)(this + 0x50) = pFVar5;
    return pFVar5;
  }
  pFVar5 = GetLocalFrameDisplay(this);
  if (pFVar5 == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1d22,"(frameDisplay != nullptr)","frameDisplay != nullptr");
    if (!bVar3) goto LAB_00986f9c;
    *puVar6 = 0;
  }
  pFVar5->tag = true;
  pFVar5->strictMode = (Type)((byte)((ushort)uVar1 >> 8) & 1);
  uVar4 = *(int *)(*(long *)(this + 0x88) + 0x158) + 1;
  pFVar5->length = (Type)uVar4;
  if (*(ushort *)((long)argEnv + 2) + 1 != (uVar4 & 0xffff)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1d27,
                                "(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1)"
                                ,
                                "frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1"
                               );
    if (!bVar3) {
LAB_00986f9c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (*(short *)((long)argEnv + 2) != 0) {
    index = 0;
    do {
      index_00 = index + 1;
      item = FrameDisplay::GetItem((FrameDisplay *)argEnv,index);
      FrameDisplay::SetItem(pFVar5,index_00,item);
      index = index_00;
    } while (index_00 < *(ushort *)((long)argEnv + 2));
  }
  FrameDisplay::SetItem(pFVar5,0,argHead);
  return pFVar5;
}

Assistant:

FrameDisplay *
        InterpreterStackFrame::NewFrameDisplay(void *argHead, void *argEnv)
    {
        FrameDisplay *frameDisplay;
        bool strict = this->m_functionBody->GetIsStrictMode();

        if (!this->m_functionBody->DoStackFrameDisplay() || !this->GetLocalFrameDisplay())
        {
            // Null local frame display probably indicates that we bailed out of an inlinee.
            // Once we support stack closures in inlined functions, we can just assert that this value
            // is never null if we should be allocating on the stack.
            return this->OP_LdFrameDisplaySetLocal(argHead, argEnv, this->GetScriptContext());
        }

        frameDisplay = this->GetLocalFrameDisplay();
        Assert(frameDisplay != nullptr);

        frameDisplay->SetTag(true);
        frameDisplay->SetStrictMode(strict);
        frameDisplay->SetLength(this->m_functionBody->GetEnvDepth() + 1);
        Assert(frameDisplay->GetLength() == ((FrameDisplay*)argEnv)->GetLength() + 1);

        for (uint i = 0; i < ((FrameDisplay*)argEnv)->GetLength(); i++)
        {
            frameDisplay->SetItem(i + 1, ((FrameDisplay*)argEnv)->GetItem(i));
        }
        frameDisplay->SetItem(0, argHead);

        return frameDisplay;
    }